

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arith.cpp
# Opt level: O3

void __thiscall DragonParser::InterNamespace::Arith::Arith(Arith *this,Token *tkn,Expr *x1,Expr *x2)

{
  Type *t;
  
  t = SymbolNamespace::Type::max(&x1->type,&x2->type);
  Op::Op(&this->super_Op,tkn,t);
  (this->super_Op).super_Expr._vptr_Expr = (_func_int **)&PTR_gen_0010acf0;
  Expr::Expr(&this->expr1);
  Expr::Expr(&this->expr2);
  (this->expr1).super_Node.lex_line = (x1->super_Node).lex_line;
  (this->expr1).op.tag = (x1->op).tag;
  SymbolNamespace::Type::operator=(&(this->expr1).type,&x1->type);
  (this->expr2).super_Node.lex_line = (x2->super_Node).lex_line;
  (this->expr2).op.tag = (x2->op).tag;
  SymbolNamespace::Type::operator=(&(this->expr2).type,&x2->type);
  return;
}

Assistant:

Arith::Arith(Token &tkn, Expr &x1, Expr &x2) :
            Op(tkn, const_cast<Type&>(*(Type::max(x1.type, x2.type)))) {
        expr1 = x1;
        expr2 = x2;
    }